

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme,XMLSize_t schemeLen)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  XMLSize_t XVar4;
  
  bVar1 = XMLString::isAlpha(*scheme);
  if (bVar1) {
    bVar1 = true;
    if (1 < schemeLen) {
      XVar4 = 1;
      do {
        bVar2 = XMLString::isAlphaNum(scheme[XVar4]);
        if ((!bVar2) && (iVar3 = XMLString::indexOf(L"+-.",scheme[XVar4]), iVar3 == -1))
        goto LAB_00255b22;
        XVar4 = XVar4 + 1;
      } while (schemeLen != XVar4);
    }
  }
  else {
LAB_00255b22:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool XMLUri::isConformantSchemeName( const XMLCh* const scheme
                                   , const XMLSize_t schemeLen)
{
    if (!XMLString::isAlpha(*scheme))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    for (XMLSize_t i=1; i<schemeLen; i++)
    {
        if ( !XMLString::isAlphaNum(scheme[i]) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, scheme[i]) == -1))
            return false;
    }

    return true;
}